

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

BmsFileOpenException * __thiscall
BmsFileOpenException::Message_abi_cxx11_(BmsFileOpenException *this)

{
  ostream *poVar1;
  long in_RSI;
  stringstream local_1a0 [8];
  stringstream os;
  ostream local_190 [384];
  BmsFileOpenException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"BMS File open failed. ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 0x28));
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
BmsFileOpenException::Message( void ) const
{
  std::stringstream os;
  os << "BMS File open failed. " << filename_ << "(" << error_number_ << ")";
  return os.str();
}